

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

int __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::erase
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          int *key)

{
  int iVar1;
  int iVar2;
  int *__a;
  int *piVar3;
  int *in_RSI;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *in_RDI;
  double dVar4;
  int unaff_retaddr;
  data_node_type *in_stack_00000008;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *in_stack_00000010;
  int num_erased;
  data_node_type *leaf;
  double tolerance;
  int bucketID_prediction_rounded;
  data_node_type *leaf_1;
  int bucketID;
  double bucketID_prediction;
  model_node_type *node;
  AlexNode<int,_int> *cur;
  value_type *in_stack_ffffffffffffff48;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this_00;
  int *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int local_54 [3];
  double local_48;
  pointer local_40;
  model_node_type *pmVar5;
  undefined1 left;
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
  *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this_01;
  model_node_type *local_8;
  
  iVar2 = *in_RSI;
  this_01 = (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *)0x0;
  local_8 = (model_node_type *)
            (((_Vector_impl *)&(in_RDI->super_AlexNode<int,_int>)._vptr_AlexNode)->
            super__Vector_impl_data)._M_start;
  this_00 = in_RDI;
  if (((local_8->super_AlexNode<int,_int>).is_leaf_ & 1U) == 0) {
    do {
      local_40 = (pointer)local_8;
      local_48 = LinearModel<int>::predict_double((LinearModel<int> *)(local_40 + 1),iVar2);
      local_54[2] = (int)local_48;
      local_54[1] = 0;
      __a = std::max<int>(local_54 + 2,local_54 + 1);
      local_54[0] = *(int *)&local_40[3].node + -1;
      piVar3 = std::min<int>(__a,local_54);
      iVar1 = (int)__a;
      local_54[2] = *piVar3;
      if (this_01 !=
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *)0x0) {
        iVar1 = (int)this_01;
        std::
        vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
        ::push_back((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                     *)in_RDI,in_stack_ffffffffffffff48);
      }
      local_8 = *(model_node_type **)(*(long *)&local_40[3].bucketID + (long)local_54[2] * 8);
    } while ((*(int *)((long)&local_8->super_AlexNode<int,_int> + 8) & 1) == 0);
    this_00->expansion_threshold_ =
         (double)((long)this_00->expansion_threshold_ +
                 (long)*(short *)((long)&local_8->super_AlexNode<int,_int> + 10));
    in_stack_ffffffffffffff8c = (int)(local_48 + 0.5);
    pmVar5 = local_8;
    dVar4 = std::numeric_limits<double>::epsilon();
    left = (undefined1)((ulong)pmVar5 >> 0x38);
    in_stack_ffffffffffffff80 = (int *)(dVar4 * 10.0 * local_48);
    dVar4 = local_48 - (double)in_stack_ffffffffffffff8c;
    std::abs(iVar1);
    if (dVar4 <= (double)in_stack_ffffffffffffff80) {
      if (local_48 < (double)in_stack_ffffffffffffff8c) {
        if ((local_8->children_ != (AlexNode<int,_int> **)0x0) &&
           (iVar1 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                    ::first_key(this_00), iVar1 <= iVar2)) {
          if (this_01 !=
              (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *)0x0)
          {
            correct_traversal_path
                      (this_01,(data_node_type *)
                               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       in_stack_ffffffffffffffd0,(bool)left);
          }
          local_8 = (model_node_type *)local_8->children_;
        }
      }
      else if ((((pointer)(local_8 + 1))->node != (model_node_type *)0x0) &&
              (iVar1 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                       ::last_key(this_00), iVar2 <= iVar1)) {
        if (this_01 !=
            (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *)0x0) {
          correct_traversal_path
                    (this_01,(data_node_type *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     in_stack_ffffffffffffffd0,(bool)left);
        }
        local_8 = ((pointer)(local_8 + 1))->node;
      }
    }
  }
  iVar2 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
          erase((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                in_stack_ffffffffffffff80);
  *(int *)&in_RDI->key_less_ = *(int *)&in_RDI->key_less_ - iVar2;
  if (*(int *)((long)&local_8[1].super_AlexNode<int,_int>.model_ + 0xc) == 0) {
    merge(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  }
  if (in_RDI->min_key_ < *in_RSI) {
    in_RDI->num_right_out_of_bounds_inserts_ = in_RDI->num_right_out_of_bounds_inserts_ - iVar2;
  }
  else if (*in_RSI < in_RDI->max_key_) {
    in_RDI->num_left_out_of_bounds_inserts_ = in_RDI->num_left_out_of_bounds_inserts_ - iVar2;
  }
  return iVar2;
}

Assistant:

int erase(const T& key) {
    data_node_type* leaf = get_leaf(key);
    int num_erased = leaf->erase(key);
    stats_.num_keys -= num_erased;
    if (leaf->num_keys_ == 0) {
      merge(leaf, key);
    }
    if (key > istats_.key_domain_max_) {
      istats_.num_keys_above_key_domain -= num_erased;
    } else if (key < istats_.key_domain_min_) {
      istats_.num_keys_below_key_domain -= num_erased;
    }
    return num_erased;
  }